

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O0

Hop_Obj_t * Abc_NodeBuildFromMini(Hop_Man_t *pMan,If_Man_t *p,If_Cut_t *pCut,int fUseDsd)

{
  Vec_Int_t *vAig;
  int nLeaves;
  Hop_Obj_t *pHVar1;
  int local_28;
  int Delay;
  int fUseDsd_local;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  Hop_Man_t *pMan_local;
  
  if (fUseDsd == 0) {
    local_28 = If_CutSopBalanceEval(p,pCut,p->vArray);
  }
  else {
    local_28 = If_CutDsdBalanceEval(p,pCut,p->vArray);
  }
  if (-1 < local_28) {
    vAig = p->vArray;
    nLeaves = If_CutLeaveNum(pCut);
    pHVar1 = Abc_NodeBuildFromMiniInt(pMan,vAig,nLeaves);
    return pHVar1;
  }
  __assert_fail("Delay >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                ,0x1a5,"Hop_Obj_t *Abc_NodeBuildFromMini(Hop_Man_t *, If_Man_t *, If_Cut_t *, int)")
  ;
}

Assistant:

Hop_Obj_t * Abc_NodeBuildFromMini( Hop_Man_t * pMan, If_Man_t * p, If_Cut_t * pCut, int fUseDsd )
{
    int Delay;
    if ( fUseDsd )
        Delay = If_CutDsdBalanceEval( p, pCut, p->vArray );
    else
        Delay = If_CutSopBalanceEval( p, pCut, p->vArray );
    assert( Delay >= 0 );
    return Abc_NodeBuildFromMiniInt( pMan, p->vArray, If_CutLeaveNum(pCut) );
}